

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void GetNodeFunctions(ExpressionContext *ctx,SynBase *source,ExprBase *function,
                     SmallArray<FunctionValue,_32U> *functions)

{
  FunctionData *pFVar1;
  ExprPassthrough *pEVar2;
  SynBase *pSVar3;
  SynBase *pSVar4;
  ExprBase *pEVar5;
  SynBase *pSVar6;
  FunctionValue local_e8;
  ShortFunctionHandle *local_d0;
  ShortFunctionHandle *option;
  ExprShortFunctionOverloadSet *node_5;
  ExprBase *local_a8;
  ExprBase *context;
  FunctionHandle *arg;
  ExprFunctionOverloadSet *node_4;
  ExprGenericFunctionPrototype *local_78;
  ExprGenericFunctionPrototype *node_3;
  ExprFunctionDefinition *local_58;
  ExprFunctionDefinition *node_2;
  ExprFunctionAccess *local_38;
  ExprFunctionAccess *node_1;
  ExprPassthrough *node;
  SmallArray<FunctionValue,_32U> *functions_local;
  ExprBase *function_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  node = (ExprPassthrough *)functions;
  functions_local = (SmallArray<FunctionValue,_32U> *)function;
  function_local = (ExprBase *)source;
  source_local = (SynBase *)ctx;
  node_1 = (ExprFunctionAccess *)getType<ExprPassthrough>(function);
  if (node_1 != (ExprFunctionAccess *)0x0) {
    functions_local = (SmallArray<FunctionValue,_32U> *)node_1->function;
  }
  local_38 = getType<ExprFunctionAccess>((ExprBase *)functions_local);
  pEVar2 = node;
  if (local_38 == (ExprFunctionAccess *)0x0) {
    local_58 = getType<ExprFunctionDefinition>((ExprBase *)functions_local);
    pSVar3 = source_local;
    pEVar2 = node;
    if (local_58 == (ExprFunctionDefinition *)0x0) {
      local_78 = getType<ExprGenericFunctionPrototype>((ExprBase *)functions_local);
      pSVar3 = source_local;
      pEVar2 = node;
      if (local_78 == (ExprGenericFunctionPrototype *)0x0) {
        arg = (FunctionHandle *)getType<ExprFunctionOverloadSet>((ExprBase *)functions_local);
        if ((ExprFunctionOverloadSet *)arg == (ExprFunctionOverloadSet *)0x0) {
          option = (ShortFunctionHandle *)
                   getType<ExprShortFunctionOverloadSet>((ExprBase *)functions_local);
          if ((ExprShortFunctionOverloadSet *)option != (ExprShortFunctionOverloadSet *)0x0) {
            for (local_d0 = (((ExprShortFunctionOverloadSet *)option)->functions).head;
                pEVar2 = node, local_d0 != (ShortFunctionHandle *)0x0; local_d0 = local_d0->next) {
              FunctionValue::FunctionValue
                        (&local_e8,(SynBase *)option->next,local_d0->function,local_d0->context);
              SmallArray<FunctionValue,_32U>::push_back
                        ((SmallArray<FunctionValue,_32U> *)pEVar2,&local_e8);
            }
          }
        }
        else {
          for (context = (ExprBase *)(((ExprFunctionOverloadSet *)arg)->functions).head;
              pSVar3 = source_local, context != (ExprBase *)0x0;
              context = *(ExprBase **)&context->typeID) {
            local_a8 = *(ExprBase **)&arg[2].listed;
            if (local_a8 == (ExprBase *)0x0) {
              pSVar6 = &ExpressionContext::MakeInternal
                                  ((ExpressionContext *)source_local,(SynBase *)function_local)->
                        super_SynBase;
              local_a8 = CreateFunctionContextAccess
                                   ((ExpressionContext *)pSVar3,pSVar6,
                                    (FunctionData *)context->_vptr_ExprBase);
            }
            pEVar2 = node;
            FunctionValue::FunctionValue
                      ((FunctionValue *)&node_5,*(SynBase **)&arg->listed,
                       (FunctionData *)context->_vptr_ExprBase,local_a8);
            SmallArray<FunctionValue,_32U>::push_back
                      ((SmallArray<FunctionValue,_32U> *)pEVar2,(FunctionValue *)&node_5);
          }
        }
      }
      else {
        pSVar6 = (local_78->super_ExprBase).source;
        pFVar1 = local_78->function;
        pSVar4 = &ExpressionContext::MakeInternal
                            ((ExpressionContext *)source_local,(SynBase *)function_local)->
                  super_SynBase;
        pEVar5 = CreateFunctionContextAccess((ExpressionContext *)pSVar3,pSVar4,local_78->function);
        FunctionValue::FunctionValue((FunctionValue *)&node_4,pSVar6,pFVar1,pEVar5);
        SmallArray<FunctionValue,_32U>::push_back
                  ((SmallArray<FunctionValue,_32U> *)pEVar2,(FunctionValue *)&node_4);
      }
    }
    else {
      pSVar6 = (local_58->super_ExprBase).source;
      pFVar1 = local_58->function;
      pSVar4 = &ExpressionContext::MakeInternal
                          ((ExpressionContext *)source_local,(SynBase *)function_local)->
                super_SynBase;
      pEVar5 = CreateFunctionContextAccess((ExpressionContext *)pSVar3,pSVar4,local_58->function);
      FunctionValue::FunctionValue((FunctionValue *)&node_3,pSVar6,pFVar1,pEVar5);
      SmallArray<FunctionValue,_32U>::push_back
                ((SmallArray<FunctionValue,_32U> *)pEVar2,(FunctionValue *)&node_3);
    }
  }
  else {
    FunctionValue::FunctionValue
              ((FunctionValue *)&node_2,(local_38->super_ExprBase).source,local_38->function,
               local_38->context);
    SmallArray<FunctionValue,_32U>::push_back
              ((SmallArray<FunctionValue,_32U> *)pEVar2,(FunctionValue *)&node_2);
  }
  return;
}

Assistant:

void GetNodeFunctions(ExpressionContext &ctx, SynBase *source, ExprBase *function, SmallArray<FunctionValue, 32> &functions)
{
	if(ExprPassthrough *node = getType<ExprPassthrough>(function))
		function = node->value;

	if(ExprFunctionAccess *node = getType<ExprFunctionAccess>(function))
	{
		functions.push_back(FunctionValue(node->source, node->function, node->context));
	}
	else if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(function))
	{
		functions.push_back(FunctionValue(node->source, node->function, CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), node->function)));
	}
	else if(ExprGenericFunctionPrototype *node = getType<ExprGenericFunctionPrototype>(function))
	{
		functions.push_back(FunctionValue(node->source, node->function, CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), node->function)));
	}
	else if(ExprFunctionOverloadSet *node = getType<ExprFunctionOverloadSet>(function))
	{
		for(FunctionHandle *arg = node->functions.head; arg; arg = arg->next)
		{
			ExprBase *context = node->context;

			if(!context)
				context = CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), arg->function);

			functions.push_back(FunctionValue(node->source, arg->function, context));
		}
	}
	else if(ExprShortFunctionOverloadSet *node = getType<ExprShortFunctionOverloadSet>(function))
	{
		for(ShortFunctionHandle *option = node->functions.head; option; option = option->next)
			functions.push_back(FunctionValue(node->source, option->function, option->context));
	}
}